

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

bool miniros::service::exists(string *service_name,bool print_failure_reason)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  string *psVar5;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  socklen_t __len;
  byte in_SIL;
  bool enabled_1;
  bool enabled;
  uint32_t size;
  shared_ptr<unsigned_char[]> buffer;
  M_string m;
  TransportTCPPtr transport;
  uint32_t port;
  string host;
  string mapped_name;
  undefined8 in_stack_fffffffffffffd78;
  LogLocation *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffda0;
  Level LVar9;
  Level in_stack_fffffffffffffda4;
  string *in_stack_fffffffffffffda8;
  LogLocation *in_stack_fffffffffffffdb0;
  key_type *in_stack_fffffffffffffdb8;
  void *pvVar10;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined1 local_1c1 [39];
  undefined1 local_19a;
  allocator<char> local_199;
  string local_198 [32];
  int local_178;
  uint local_174;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> local_170;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  uint32_t *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  ServiceManager *in_stack_ffffffffffffff08;
  allocator<char> local_e1;
  string local_e0 [8];
  undefined1 local_c0 [4];
  uint local_5c;
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  byte local_1;
  
  LVar9 = (Level)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  local_11 = in_SIL & 1;
  names::resolve(in_stack_fffffffffffffd88,SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
  std::__cxx11::string::string(local_58);
  ServiceManager::instance();
  std::__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4a230e);
  __len = (socklen_t)&local_5c;
  bVar1 = ServiceManager::lookupService
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0);
  if (bVar1) {
    std::make_shared<miniros::TransportTCP,miniros::PollSet*,miniros::TransportTCP::Flags>
              ((PollSet **)in_stack_fffffffffffffda8,
               (Flags *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    peVar3 = std::
             __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4a238a);
    uVar2 = TransportTCP::connect(peVar3,(int)local_58,(sockaddr *)(ulong)local_5c,__len);
    if ((uVar2 & 1) == 0) {
      if ((local_11 & 1) != 0) {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((exists::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0)
          ;
          console::initializeLogLocation
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator(&local_199);
        }
        if (exists::loc.level_ != Info) {
          console::setLogLocationLevel(in_stack_fffffffffffffd80,LVar9);
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        }
        local_19a = (exists::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_19a) {
          pvVar10 = exists::loc.logger_;
          LVar9 = exists::loc.level_;
          uVar8 = std::__cxx11::string::c_str();
          uVar7 = std::__cxx11::string::c_str();
          console::print((FilterBase *)0x0,pvVar10,(Level)(ulong)LVar9,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                         ,0x48,"bool miniros::service::exists(const std::string &, bool)",
                         "waitForService: Service [%s] could not connect to host [%s:%d], waiting..."
                         ,uVar8,uVar7,local_5c);
        }
      }
      local_178 = 0;
    }
    else {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x4a23c7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      std::__cxx11::string::operator=((string *)pmVar4,"1");
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      std::__cxx11::string::operator=((string *)pmVar4,"*");
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
      psVar5 = this_node::getName_abi_cxx11_();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar5);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      std::__cxx11::string::operator=((string *)pmVar4,local_38);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator(&local_159);
      std::shared_ptr<unsigned_char[]>::shared_ptr((shared_ptr<unsigned_char[]> *)0x4a25e0);
      local_174 = 0;
      Header::write((int)local_c0,&local_170,(size_t)&local_174);
      peVar3 = std::
               __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4a2614);
      (*(peVar3->super_Transport)._vptr_Transport[3])(peVar3,&local_174,4);
      peVar3 = std::
               __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4a263c);
      peVar6 = std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get(&local_170);
      (*(peVar3->super_Transport)._vptr_Transport[3])(peVar3,peVar6,(ulong)local_174);
      peVar3 = std::
               __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4a2675);
      (*(peVar3->super_Transport)._vptr_Transport[8])();
      local_1 = 1;
      local_178 = 1;
      std::shared_ptr<unsigned_char[]>::~shared_ptr((shared_ptr<unsigned_char[]> *)0x4a26a3);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4a26b0);
    }
    std::shared_ptr<miniros::TransportTCP>::~shared_ptr
              ((shared_ptr<miniros::TransportTCP> *)0x4a2a45);
    if (local_178 != 0) goto LAB_004a2c31;
  }
  else if ((local_11 & 1) != 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((exists(std::__cxx11::string_const&,bool)::loc.initialized_ ^ 0xffU) & 1) != 0) {
      psVar5 = (string *)local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
      console::initializeLogLocation(in_stack_fffffffffffffdb0,psVar5,in_stack_fffffffffffffda4);
      std::__cxx11::string::~string((string *)(local_1c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1c1);
    }
    if (exists(std::__cxx11::string_const&,bool)::loc.level_ != Info) {
      console::setLogLocationLevel(in_stack_fffffffffffffd80,LVar9);
      console::checkLogLocationEnabled
                ((LogLocation *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
    pvVar10 = exists(std::__cxx11::string_const&,bool)::loc.logger_;
    if ((exists(std::__cxx11::string_const&,bool)::loc.logger_enabled_ & 1U) != 0) {
      LVar9 = exists(std::__cxx11::string_const&,bool)::loc.level_;
      uVar8 = std::__cxx11::string::c_str();
      console::print((FilterBase *)0x0,pvVar10,(Level)(ulong)LVar9,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                     ,0x50,"bool miniros::service::exists(const std::string &, bool)",
                     "waitForService: Service [%s] has not been advertised, waiting...",uVar8);
    }
  }
  local_1 = 0;
  local_178 = 1;
LAB_004a2c31:
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool service::exists(const std::string& service_name, bool print_failure_reason)
{
  std::string mapped_name = names::resolve(service_name);

  std::string host;
  uint32_t port;

  if (ServiceManager::instance()->lookupService(mapped_name, host, port))
  {
    TransportTCPPtr transport(std::make_shared<TransportTCP>(static_cast<miniros::PollSet*>(NULL), TransportTCP::SYNCHRONOUS));

    if (transport->connect(host, port))
    {
      M_string m;
      m["probe"] = "1";
      m["md5sum"] = "*";
      m["callerid"] = this_node::getName();
      m["service"] = mapped_name;
      std::shared_ptr<uint8_t[]> buffer;
      uint32_t size = 0;;
      Header::write(m, buffer, size);
      transport->write((uint8_t*)&size, sizeof(size));
      transport->write(buffer.get(), size);
      transport->close();

      return true;
    }
    else
    {
      if (print_failure_reason)
      {
        MINIROS_INFO("waitForService: Service [%s] could not connect to host [%s:%d], waiting...", mapped_name.c_str(), host.c_str(), port);
      }
    }
  }
  else
  {
    if (print_failure_reason)
    {
      MINIROS_INFO("waitForService: Service [%s] has not been advertised, waiting...", mapped_name.c_str());
    }
  }

  return false;
}